

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldDescriptor::CopyTo(FieldDescriptor *this,FieldDescriptorProto *proto)

{
  byte *pbVar1;
  uint uVar2;
  ushort *puVar3;
  char *pcVar4;
  FeatureSet *from;
  string *psVar5;
  Descriptor *pDVar6;
  EnumDescriptor *pEVar7;
  OneofDescriptor *pOVar8;
  FieldOptions *this_00;
  FieldOptions *pFVar9;
  FeatureSet *this_01;
  byte bVar10;
  Arena *pAVar11;
  FieldDescriptorProto_Label value;
  FieldDescriptorProto_Type value_00;
  string_view value_01;
  string_view value_02;
  AlphaNum local_48;
  
  puVar3 = (ushort *)(this->all_names_).payload_;
  value_01._M_len = (ulong)*puVar3;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  value_01._M_str = (char *)((long)puVar3 + ~value_01._M_len);
  pAVar11 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar11 & 1) != 0) {
    pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value_01,pAVar11);
  (proto->field_0)._impl_.number_ = this->number_;
  uVar2 = *(uint *)&proto->field_0;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar2 | 0x40;
  bVar10 = this->field_0x1;
  if ((bVar10 & 4) != 0) {
    pcVar4 = (this->all_names_).payload_;
    value_02._M_len = (ulong)*(ushort *)(pcVar4 + 0xe);
    value_02._M_str = pcVar4 + -(ulong)*(ushort *)(pcVar4 + 0xc);
    (proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar2 | 0x50;
    pAVar11 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar11 & 1) != 0) {
      pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.json_name_,value_02,pAVar11);
    bVar10 = this->field_0x1;
  }
  if ((bVar10 & 2) != 0) {
    (proto->field_0)._impl_.proto3_optional_ = true;
    pbVar1 = (byte *)((long)&proto->field_0 + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  if (((this->merged_features_->field_0)._impl_.field_presence_ == 3) &&
     (999 < (int)this->file_->edition_)) {
    value = FieldDescriptorProto_Label_LABEL_OPTIONAL;
  }
  else {
    value = (FieldDescriptorProto_Label)((byte)this->field_0x1 >> 6);
  }
  FieldDescriptorProto::set_label(proto,value);
  bVar10 = this->type_;
  value_00 = (uint)bVar10;
  if ((bVar10 == 10) && (value_00 = (uint)bVar10, 999 < (int)this->file_->edition_)) {
    value_00 = FieldDescriptorProto_Type_TYPE_MESSAGE;
  }
  FieldDescriptorProto::set_type(proto,value_00);
  if ((this->field_0x1 & 8) != 0) {
    if ((this->containing_type_->field_0x1 & 2) == 0) {
      *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
      pAVar11 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.extendee_,".",pAVar11);
    }
    psVar5 = FieldDescriptorProto::_internal_mutable_extendee_abi_cxx11_(proto);
    local_48.piece_._M_str = (this->containing_type_->all_names_).payload_;
    local_48.piece_._M_len = (size_t)*(ushort *)(local_48.piece_._M_str + 2);
    local_48.piece_._M_str = local_48.piece_._M_str + ~local_48.piece_._M_len;
    absl::lts_20250127::StrAppend(psVar5,&local_48);
  }
  if (*(int *)(kTypeToCppTypeMap + (ulong)this->type_ * 4) == 8) {
    pEVar7 = enum_type(this);
    if ((pEVar7->field_0x1 & 2) == 0) {
      *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 4;
      pAVar11 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.type_name_,".",pAVar11);
    }
    psVar5 = FieldDescriptorProto::_internal_mutable_type_name_abi_cxx11_(proto);
    pEVar7 = enum_type(this);
    local_48.piece_._M_str = (pEVar7->all_names_).payload_;
  }
  else {
    if (*(int *)(kTypeToCppTypeMap + (ulong)this->type_ * 4) != 10) goto LAB_001cc122;
    pDVar6 = message_type(this);
    if ((pDVar6->field_0x1 & 1) != 0) {
      (proto->field_0)._impl_.type_ = 1;
      pbVar1 = (byte *)((long)&proto->field_0 + 1);
      *pbVar1 = *pbVar1 & 0xfb;
    }
    pDVar6 = message_type(this);
    if ((pDVar6->field_0x1 & 2) == 0) {
      *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 4;
      pAVar11 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.type_name_,".",pAVar11);
    }
    psVar5 = FieldDescriptorProto::_internal_mutable_type_name_abi_cxx11_(proto);
    pDVar6 = message_type(this);
    local_48.piece_._M_str = (pDVar6->all_names_).payload_;
  }
  local_48.piece_._M_len = (size_t)*(ushort *)(local_48.piece_._M_str + 2);
  local_48.piece_._M_str = local_48.piece_._M_str + ~local_48.piece_._M_len;
  absl::lts_20250127::StrAppend(psVar5,&local_48);
LAB_001cc122:
  if ((this->field_0x1 & 1) != 0) {
    DefaultValueAsString_abi_cxx11_((string *)&local_48,this,false);
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 8;
    pAVar11 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar11 & 1) != 0) {
      pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set
              (&(proto->field_0)._impl_.default_value_,(string *)&local_48,pAVar11);
    std::__cxx11::string::~string((string *)&local_48);
  }
  pOVar8 = containing_oneof(this);
  if ((pOVar8 != (OneofDescriptor *)0x0) && ((this->field_0x1 & 8) == 0)) {
    pOVar8 = containing_oneof(this);
    (proto->field_0)._impl_.oneof_index_ =
         (int32_t)(((long)pOVar8 - (long)pOVar8->containing_type_->oneof_decls_) / 0x38);
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 0x80;
  }
  pFVar9 = this->options_;
  if (pFVar9 != (FieldOptions *)_FieldOptions_default_instance_) {
    this_00 = FieldDescriptorProto::mutable_options(proto);
    FieldOptions::CopyFrom(this_00,pFVar9);
  }
  if ((~this->field_0x3 & 6) != 0) {
    pFVar9 = FieldDescriptorProto::mutable_options(proto);
    FieldOptions::set_ctype
              (pFVar9,(byte)this->field_0x3 >> 1 &
                      (FieldOptions_CType_STRING_PIECE|FieldOptions_CType_CORD));
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    pFVar9 = FieldDescriptorProto::mutable_options(proto);
    this_01 = FieldOptions::mutable_features(pFVar9);
    FeatureSet::CopyFrom(this_01,from);
  }
  return;
}

Assistant:

void FieldDescriptor::CopyTo(FieldDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());
  if (has_json_name_) {
    proto->set_json_name(json_name());
  }
  if (proto3_optional_) {
    proto->set_proto3_optional(true);
  }
  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  if (is_required() && !IsLegacyEdition(file()->edition())) {
    // Editions files have no required keyword, and we only set this label
    // during descriptor build.
    proto->set_label(static_cast<FieldDescriptorProto::Label>(
        absl::implicit_cast<int>(LABEL_OPTIONAL)));
  } else {
    proto->set_label(static_cast<FieldDescriptorProto::Label>(
        absl::implicit_cast<int>(static_cast<Label>(label_))));
  }
  if (type() == TYPE_GROUP && !IsLegacyEdition(file()->edition())) {
    // Editions files have no group keyword, and we only set this label
    // during descriptor build.
    proto->set_type(static_cast<FieldDescriptorProto::Type>(
        absl::implicit_cast<int>(TYPE_MESSAGE)));
  } else {
    proto->set_type(static_cast<FieldDescriptorProto::Type>(
        absl::implicit_cast<int>(type())));
  }

  if (is_extension()) {
    if (!containing_type()->is_unqualified_placeholder_) {
      proto->set_extendee(".");
    }
    absl::StrAppend(proto->mutable_extendee(), containing_type()->full_name());
  }

  if (cpp_type() == CPPTYPE_MESSAGE) {
    if (message_type()->is_placeholder_) {
      // We don't actually know if the type is a message type.  It could be
      // an enum.
      proto->clear_type();
    }

    if (!message_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    absl::StrAppend(proto->mutable_type_name(), message_type()->full_name());
  } else if (cpp_type() == CPPTYPE_ENUM) {
    if (!enum_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    absl::StrAppend(proto->mutable_type_name(), enum_type()->full_name());
  }

  if (has_default_value()) {
    proto->set_default_value(DefaultValueAsString(false));
  }

  if (containing_oneof() != nullptr && !is_extension()) {
    proto->set_oneof_index(containing_oneof()->index());
  }

  if (&options() != &FieldOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  if (has_legacy_proto_ctype()) {
    proto->mutable_options()->set_ctype(
        static_cast<FieldOptions::CType>(legacy_proto_ctype()));
  }

  RestoreFeaturesToOptions(proto_features_, proto);
}